

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagFileTest_FilenamesOurfileFirst::Run(void)

{
  allocator local_52;
  allocator local_51;
  FlagSaver fs;
  string local_48;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FilenamesOurfileFirst");
  std::__cxx11::string::assign(fLS::FLAGS_test_string_abi_cxx11_);
  fLI::FLAGS_test_int32 = 0xffffffff;
  fLB::FLAGS_test_bool = 0;
  fLD::FLAGS_test_double = 0xbff0000000000000;
  std::__cxx11::string::string
            ((string *)&local_28,
             "-test_string=continued\n# some comments are in order\n# some\n  # comments\n#are\n                  #trickier\n# than others\ngflags_unittest\n-test_bool=true\n     -test_int32=1\nnot_our_filename\n-test_double=1000.0\n"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_48,"continued",&local_52);
  TestFlagString(&local_28,&local_48,true,1,-1.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  FlagSaver::~FlagSaver(&fs);
  return;
}

Assistant:

TEST(FlagFileTest, FilenamesOurfileFirst) {
  FLAGS_test_string = "initial";
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_double = -1.0;
  TestFlagString(
      // Flag string
      "-test_string=continued\n"
      "# some comments are in order\n"
      "# some\n"
      "  # comments\n"
      "#are\n"
      "                  #trickier\n"
      "# than others\n"
      "gflags_unittest\n"
      "-test_bool=true\n"
      "     -test_int32=1\n"
      "not_our_filename\n"
      "-test_double=1000.0\n",
      // Expected values
      "continued",
      true,
      1,
      -1.0);
}